

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer pfVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  Model *pMVar10;
  pointer piVar11;
  pointer piVar12;
  invalid_argument *this_00;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  vector<int,_std::allocator<int>_> idx;
  shared_ptr<fasttext::Matrix> ninput;
  undefined1 local_79;
  vector<int,_std::allocator<int>_> local_78;
  Matrix *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  unsigned_long local_50;
  shared_ptr<fasttext::QMatrix> local_48;
  shared_ptr<fasttext::QMatrix> local_38;
  
  peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->model == sup) {
    std::__cxx11::string::_M_assign((string *)peVar3);
    peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3->qout = qargs->qout;
    std::__cxx11::string::_M_assign((string *)&peVar3->output);
    uVar16 = qargs->cutoff;
    if ((uVar16 != 0) &&
       (uVar16 < (ulong)((this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        m_)) {
      selectEmbeddings(&local_78,this,(int32_t)uVar16);
      Dictionary::prune((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_78);
      local_50 = (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      local_60 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<fasttext::Matrix,std::allocator<fasttext::Matrix>,unsigned_long,int&>
                (&local_58,&local_60,(allocator<fasttext::Matrix> *)&local_79,&local_50,
                 &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->dim);
      if ((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar13 = (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        peVar4 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        uVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->dim;
        lVar14 = 0;
        lVar15 = 0;
        do {
          if (0 < (int)uVar1) {
            iVar2 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15];
            lVar5 = peVar4->n_;
            lVar6 = (long)(peVar4->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start;
            lVar7 = local_60->n_;
            pfVar8 = (local_60->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              *(undefined4 *)((long)pfVar8 + uVar16 * 4 + lVar7 * lVar14) =
                   *(undefined4 *)(iVar2 * lVar5 * 4 + lVar6 + uVar16 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar1 != uVar16);
          }
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + 4;
        } while (lVar15 != lVar13 + (ulong)(lVar13 == 0));
      }
      (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_60;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_58);
      if (qargs->retrain != false) {
        peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        peVar3->epoch = qargs->epoch;
        peVar3->lr = qargs->lr;
        peVar3->thread = qargs->thread;
        peVar3->verbose = qargs->verbose;
        startThreads(this);
      }
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::QMatrix,std::allocator<fasttext::QMatrix>,fasttext::Matrix&,unsigned_long_const&,bool_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,(QMatrix **)&local_78,
               (allocator<fasttext::QMatrix> *)&local_60,
               (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&qargs->dsub,&qargs->qnorm);
    piVar12 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    piVar11 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    p_Var9 = (this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)piVar11;
    (this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)piVar12;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true) {
      local_60 = (Matrix *)CONCAT44(local_60._4_4_,2);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<fasttext::QMatrix,std::allocator<fasttext::QMatrix>,fasttext::Matrix&,int,bool_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,(QMatrix **)&local_78,
                 (allocator<fasttext::QMatrix> *)&local_50,
                 (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(int *)&local_60,&qargs->qnorm);
      piVar12 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar11 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      p_Var9 = (this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)piVar11;
      (this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)piVar12;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
    }
    this->quant_ = true;
    local_60 = (Matrix *)((ulong)local_60 & 0xffffffff00000000);
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,(Model **)&local_78,
               (allocator<fasttext::Model> *)&local_50,&this->input_,&this->output_,&this->args_,
               (int *)&local_60);
    piVar12 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
    piVar11 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    p_Var9 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)piVar11;
    (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)piVar12;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    pMVar10 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pMVar10->quant_ = this->quant_;
    p_Var9 = (this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_38.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    p_Var9 = (this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_48.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    Model::setQuantizePointer
              (pMVar10,&local_38,&local_48,
               ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->qout);
    if (local_48.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_38.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pMVar10 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
        == sup) {
      Dictionary::getCounts
                ((vector<long,_std::allocator<long>_> *)&local_78,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,label);
      Model::setTargetCounts(pMVar10,(vector<long,_std::allocator<long>_> *)&local_78);
    }
    else {
      Dictionary::getCounts
                ((vector<long,_std::allocator<long>_> *)&local_78,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,word);
      Model::setTargetCounts(pMVar10,(vector<long,_std::allocator<long>_> *)&local_78);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"For now we only support quantization of supervised models");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::quantize(const Args qargs) {
  if (args_->model != model_name::sup) {
    throw std::invalid_argument(
        "For now we only support quantization of supervised models");
  }
  args_->input = qargs.input;
  args_->qout = qargs.qout;
  args_->output = qargs.output;

  if (qargs.cutoff > 0 && qargs.cutoff < input_->size(0)) {
    auto idx = selectEmbeddings(qargs.cutoff);
    dict_->prune(idx);
    std::shared_ptr<Matrix> ninput =
        std::make_shared<Matrix>(idx.size(), args_->dim);
    for (auto i = 0; i < idx.size(); i++) {
      for (auto j = 0; j < args_->dim; j++) {
        ninput->at(i, j) = input_->at(idx[i], j);
      }
    }
    input_ = ninput;
    if (qargs.retrain) {
      args_->epoch = qargs.epoch;
      args_->lr = qargs.lr;
      args_->thread = qargs.thread;
      args_->verbose = qargs.verbose;
      startThreads();
    }
  }

  qinput_ = std::make_shared<QMatrix>(*input_, qargs.dsub, qargs.qnorm);

  if (args_->qout) {
    qoutput_ = std::make_shared<QMatrix>(*output_, 2, qargs.qnorm);
  }

  quant_ = true;
  model_ = std::make_shared<Model>(input_, output_, args_, 0);
  model_->quant_ = quant_;
  model_->setQuantizePointer(qinput_, qoutput_, args_->qout);
  if (args_->model == model_name::sup) {
    model_->setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model_->setTargetCounts(dict_->getCounts(entry_type::word));
  }
}